

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::JunitReporter::~JunitReporter(JunitReporter *this)

{
  pointer pcVar1;
  
  (this->super_CumulativeReporterBase<Catch::JunitReporter>).super_IStreamingReporter.
  _vptr_IStreamingReporter = (_func_int **)&PTR__JunitReporter_002263b8;
  pcVar1 = (this->stdErrForSuite)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->stdErrForSuite).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->stdOutForSuite)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->stdOutForSuite).field_2) {
    operator_delete(pcVar1);
  }
  XmlWriter::~XmlWriter(&this->xml);
  CumulativeReporterBase<Catch::JunitReporter>::~CumulativeReporterBase
            (&this->super_CumulativeReporterBase<Catch::JunitReporter>);
  return;
}

Assistant:

JunitReporter::~JunitReporter() {}